

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  ulong uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  string nstrs;
  string local_50;
  
  uVar7 = result->_M_string_length;
  iVar8 = 0;
  if ((((3 < uVar7) && (pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 == '[')) && (pcVar2[1] == '['))
     && ((iVar8 = 0, pcVar2[uVar7 - 1] == ']' && (pcVar2[uVar7 - 2] == ']')))) {
    nstrs._M_dataplus._M_p = (pointer)&nstrs.field_2;
    nstrs.field_2._M_allocated_capacity._0_2_ = 0x5b;
    nstrs._M_string_length = 1;
    uVar9 = 2;
    while( true ) {
      if (uVar7 - 2 <= uVar9) break;
      pcVar3 = (result->_M_dataplus)._M_p;
      if (pcVar3[uVar9] != pcVar3[uVar9 + 1]) {
        iVar8 = 0;
        goto LAB_0012c450;
      }
      ::std::__cxx11::string::push_back((char)&nstrs);
      uVar9 = uVar9 + 2;
      uVar7 = result->_M_string_length;
    }
    ::std::__cxx11::string::push_back((char)&nstrs);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&nstrs);
    iVar8 = 1;
LAB_0012c450:
    ::std::__cxx11::string::~string((string *)&nstrs);
    if (uVar7 - 2 <= uVar9) {
      return 1;
    }
  }
  if (((this->allow_extra_args_ == false) && (this->expected_max_ < 2)) ||
     ((result->_M_string_length == 0 ||
      ((pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 != '[' ||
       (pcVar2[result->_M_string_length - 1] != ']')))))) {
    cVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    if ((cVar1 == '\0') ||
       (lVar6 = ::std::__cxx11::string::find((char)result,(ulong)(uint)(int)cVar1), lVar6 == -1)) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
      return iVar8 + 1;
    }
    detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nstrs,result,(this->super_OptionBase<CLI::Option>).delimiter_);
    sVar4 = nstrs._M_string_length;
    for (_Var10 = nstrs._M_dataplus; _Var10._M_p != (pointer)sVar4; _Var10._M_p = _Var10._M_p + 0x20
        ) {
      if (((value_type *)_Var10._M_p)->_M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(res,(value_type *)_Var10._M_p);
        iVar8 = iVar8 + 1;
      }
    }
  }
  else {
    ::std::__cxx11::string::pop_back();
    ::std::__cxx11::string::erase(result,(result->_M_dataplus)._M_p);
    ::std::__cxx11::string::string((string *)&local_50,(string *)result);
    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&nstrs,&local_50,',');
    ::std::__cxx11::string::~string((string *)&local_50);
    sVar4 = nstrs._M_string_length;
    for (_Var10 = nstrs._M_dataplus; _Var10._M_p != (pointer)sVar4; _Var10._M_p = _Var10._M_p + 0x20
        ) {
      if (((string *)_Var10._M_p)->_M_string_length != 0) {
        iVar5 = _add_result(this,(string *)_Var10._M_p,res);
        iVar8 = iVar8 + iVar5;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nstrs);
  return iVar8;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;

    // Handle the vector escape possibility all characters duplicated and starting with [[ ending with ]]
    // this is always a single result
    if(result.size() >= 4 && result[0] == '[' && result[1] == '[' && result.back() == ']' &&
       (*(result.end() - 2) == ']')) {
        // this is an escape clause for odd strings
        std::string nstrs{'['};
        bool duplicated{true};
        for(std::size_t ii = 2; ii < result.size() - 2; ii += 2) {
            if(result[ii] == result[ii + 1]) {
                nstrs.push_back(result[ii]);
            } else {
                duplicated = false;
                break;
            }
        }
        if(duplicated) {
            nstrs.push_back(']');
            res.push_back(std::move(nstrs));
            ++result_count;
            return result_count;
        }
    }

    if((allow_extra_args_ || get_expected_max() > 1) && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry

        result.pop_back();
        result.erase(result.begin());
        bool skipSection{false};
        for(auto &var : CLI::detail::split_up(result, ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        if(!skipSection) {
            return result_count;
        }
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}